

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

SDL_bool OpenSDL2AudioDevice(SDL_AudioSpec *appwant)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  SDL_AudioSpec devwant;
  SDL_AudioSpec local_30;
  
  uVar1._0_2_ = appwant->format;
  uVar1._2_1_ = appwant->channels;
  uVar1._3_1_ = appwant->silence;
  appwant->silence = (-1 < (short)(undefined2)uVar1) << 7;
  appwant->size = (uVar1 >> 3 & 0x1f) * (uint)appwant->channels * (uint)appwant->samples;
  if (audio_cbdata == (AudioCallbackWrapperData *)0x0) {
    audio_cbdata = (AudioCallbackWrapperData *)(*SDL20_calloc)(1,0x3f68);
    if (audio_cbdata == (AudioCallbackWrapperData *)0x0) {
      (*SDL20_Error)(SDL_ENOMEM);
      return SDL_FALSE;
    }
    (*SDL20_memcpy)(&local_30,appwant,0x20);
    local_30.callback = AudioCallbackWrapper;
    local_30.userdata = audio_cbdata;
    iVar2 = 0xac44;
    if (0xac44 < local_30.freq) {
      iVar2 = local_30.freq;
    }
    bVar3 = 2;
    if (2 < local_30.channels) {
      bVar3 = local_30.channels;
    }
    if ((local_30.format & 0xf0) == 0) {
      local_30.format = 0x8010;
    }
    local_30.freq = iVar2;
    local_30.channels = bVar3;
    iVar2 = (*SDL20_OpenAudio)(&local_30,&audio_cbdata->device_format);
    if (iVar2 == -1) {
      (*SDL20_free)(audio_cbdata);
      audio_cbdata = (AudioCallbackWrapperData *)0x0;
      return SDL_FALSE;
    }
    (*SDL20_LockAudio)();
    (*SDL20_PauseAudio)(0);
  }
  else {
    (*SDL20_LockAudio)();
  }
  return SDL_TRUE;
}

Assistant:

static SDL_bool
OpenSDL2AudioDevice(SDL_AudioSpec *appwant)
{
    SDL_AudioSpec devwant;

    /* note that 0x80 isn't perfect silence for U16 formats, but we only have one byte that is used for memset() calls, so it has to do. SDL2 has the same bug. */
    appwant->silence = SDL_AUDIO_ISSIGNED(appwant->format) ? 0x00 : 0x80;
    appwant->size = appwant->samples * appwant->channels * (SDL_AUDIO_BITSIZE(appwant->format) / 8);

    if (audio_cbdata != NULL) {  /* device is already open. */
        SDL20_LockAudio();  /* Device is already at acceptable parameters, just pause it for further setup by caller. */
        return SDL_TRUE;
    }

    audio_cbdata = (AudioCallbackWrapperData *) SDL20_calloc(1, sizeof (AudioCallbackWrapperData));
    if (!audio_cbdata) {
        SDL20_OutOfMemory();
        return SDL_FALSE;
    }

    /* Two things use the audio device: the app, through 1.2's SDL_OpenAudio,
       and the fake CD-ROM device. Either can open the device, and both write
       to SDL_AudioStreams to buffer and convert data. We open the device
       in a format that accommodates both inputs.

       In case the app asks for something really low-quality--an old game
       playing 8-bit mono audio at 8000Hz or whatever--we force the audio
       hardware to something better, in case the app _also_ wants to play
       CD audio, so we can get good quality out of that without reopening
       the device. We have to be able to buffer and convert between the
       app's needs and SDL2's anyhow, so this isn't a big deal. If they
       ask for better than CD quality, we'll allow it and upsample any
       CD audio that is played.

       If the CD-ROM is opened first, and the app wants better-than-CD
       quality later, there's not much we can do, it'll have to
       downsample, but I suspect this is rare, and the audio will
       still be good enough. */

    SDL20_memcpy(&devwant, appwant, sizeof (SDL_AudioSpec));
    devwant.callback = AudioCallbackWrapper;
    devwant.userdata = audio_cbdata;
    devwant.freq = SDL_max(devwant.freq, 44100);
    devwant.channels = SDL_max(devwant.channels, 2);
    if (SDL_AUDIO_BITSIZE(devwant.format) < 16) {
        devwant.format = AUDIO_S16SYS;
    }

    if (SDL20_OpenAudio(&devwant, &audio_cbdata->device_format) == -1) {
        SDL_free(audio_cbdata);
        audio_cbdata = NULL;
        return SDL_FALSE;
    }

    SDL20_LockAudio();
    SDL20_PauseAudio(0);  /* always unpause, but caller will unlock after finalizing setup. */

    return SDL_TRUE;
}